

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::
Create<glcts::(anonymous_namespace)::CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::GL>>
          (void)

{
  CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::GL> *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::GL> *)
         operator_new(0x58);
  glcts::anon_unknown_0::
  CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::GL>::
  CModeDrawElementsTriangleStripAdjacency(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}